

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZFMatrix<double>_>::TPZVec
          (TPZVec<TPZFMatrix<double>_> *this,int64_t size,TPZFMatrix<double> *copy)

{
  undefined1 auVar1 [16];
  int64_t *piVar2;
  TPZFMatrix<double> *pTVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_018c38d8;
  this->fStore = (TPZFMatrix<double> *)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZVec<TPZFMatrix<double>>::TPZVec(const int64_t, const T &) [T = TPZFMatrix<double>]"
               ,0x55);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = size;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x90),8) == 0) {
        uVar5 = SUB168(auVar1 * ZEXT816(0x90),0) | 8;
      }
      piVar2 = (int64_t *)operator_new__(uVar5);
      *piVar2 = size;
      pTVar3 = (TPZFMatrix<double> *)(piVar2 + 1);
      lVar4 = 0;
      do {
        piVar2[2] = 0;
        piVar2[3] = 0;
        *(undefined2 *)(piVar2 + 4) = 0;
        piVar2[1] = (int64_t)&PTR__TPZFMatrix_0183c898;
        piVar2[5] = 0;
        piVar2[6] = 0;
        piVar2[7] = 0;
        TPZVec<int>::TPZVec((TPZVec<int> *)(piVar2 + 8),0);
        piVar2[8] = (int64_t)&PTR__TPZManVector_0183cde8;
        piVar2[9] = (int64_t)(piVar2 + 0xc);
        piVar2[10] = 0;
        piVar2[0xb] = 0;
        piVar2[0xf] = (int64_t)&PTR__TPZVec_0183b4b0;
        piVar2[0x10] = 0;
        piVar2[0x11] = 0;
        piVar2[0x12] = 0;
        lVar4 = lVar4 + -0x90;
        piVar2 = piVar2 + 0x12;
      } while (-lVar4 != size * 0x90);
      this->fStore = pTVar3;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    if (size != 0) {
      lVar4 = 1;
      if (1 < size) {
        lVar4 = size;
      }
      lVar6 = 0;
      do {
        TPZFMatrix<double>::operator=
                  ((TPZFMatrix<double> *)
                   ((long)&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)
                             (&((TPZFMatrix<double> *)(&this->fStore->fPivot + -1))->fPivot + -1))->
                             fPivot + -1))->fPivot + lVar6 + 0xffffffffffffffc8U),copy);
        lVar6 = lVar6 + 0x90;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}